

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlStreamCompAddStep(xmlStreamCompPtr comp,xmlChar *name,xmlChar *ns,int nodeType,int flags)

{
  int iVar1;
  xmlStreamStepPtr pxVar2;
  
  if (comp->maxStep <= comp->nbStep) {
    pxVar2 = (xmlStreamStepPtr)(*xmlRealloc)(comp->steps,(long)comp->maxStep << 6);
    if (pxVar2 == (xmlStreamStepPtr)0x0) {
      return -1;
    }
    comp->steps = pxVar2;
    comp->maxStep = comp->maxStep << 1;
  }
  pxVar2 = comp->steps;
  iVar1 = comp->nbStep;
  comp->nbStep = iVar1 + 1;
  pxVar2[iVar1].flags = flags;
  pxVar2[iVar1].name = name;
  pxVar2[iVar1].ns = ns;
  pxVar2[iVar1].nodeType = nodeType;
  return iVar1;
}

Assistant:

static int
xmlStreamCompAddStep(xmlStreamCompPtr comp, const xmlChar *name,
                     const xmlChar *ns, int nodeType, int flags) {
    xmlStreamStepPtr cur;

    if (comp->nbStep >= comp->maxStep) {
	cur = (xmlStreamStepPtr) xmlRealloc(comp->steps,
				 comp->maxStep * 2 * sizeof(xmlStreamStep));
	if (cur == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamComp: malloc failed\n");
	    return(-1);
	}
	comp->steps = cur;
        comp->maxStep *= 2;
    }
    cur = &comp->steps[comp->nbStep++];
    cur->flags = flags;
    cur->name = name;
    cur->ns = ns;
    cur->nodeType = nodeType;
    return(comp->nbStep - 1);
}